

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree-dense-points.cpp
# Opt level: O3

vector<PointT,_std::allocator<PointT>_> *
read_csv(vector<PointT,_std::allocator<PointT>_> *__return_storage_ptr__,char *filename)

{
  pointer *ppPVar1;
  long lVar2;
  iterator __position;
  char *__nptr;
  float *pfVar3;
  float fVar4;
  PointT p;
  ifstream ifs;
  char line [256];
  undefined1 auStack_358 [12];
  undefined8 local_34c;
  float local_344;
  long local_340 [4];
  byte abStack_320 [488];
  char local_138 [264];
  
  (__return_storage_ptr__->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(local_340,filename,_S_in);
  lVar2 = *(long *)(local_340[0] + -0x18);
  if ((abStack_320[lVar2] & 2) == 0) {
    do {
      std::ios::widen((char)auStack_358 + (char)lVar2 + '\x18');
      std::istream::getline((char *)local_340,(long)local_138,'\0');
      __nptr = strtok(local_138,",");
      pfVar3 = (float *)&local_34c;
      while (__nptr != (char *)0x0) {
        fVar4 = strtof(__nptr,(char **)0x0);
        *pfVar3 = fVar4;
        __nptr = strtok((char *)0x0,",");
        pfVar3 = pfVar3 + 1;
      }
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<PointT,std::allocator<PointT>>::_M_realloc_insert<PointT_const&>
                  ((vector<PointT,std::allocator<PointT>> *)__return_storage_ptr__,__position,
                   (PointT *)&local_34c);
      }
      else {
        (__position._M_current)->coords[2] = local_344;
        *(undefined8 *)(__position._M_current)->coords = local_34c;
        ppPVar1 = &(__return_storage_ptr__->super__Vector_base<PointT,_std::allocator<PointT>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppPVar1 = *ppPVar1 + 1;
      }
      lVar2 = *(long *)(local_340[0] + -0x18);
    } while ((abStack_320[lVar2] & 2) == 0);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_340);
  return __return_storage_ptr__;
}

Assistant:

std::vector<PointT> read_csv(const char *filename)
{
  std::vector<PointT> points;
  std::ifstream ifs(filename);

  char line[256];
  while (!ifs.eof())
  {
    ifs.getline(line, 256);
    PointT p;
    char* token = strtok(line, ",");
    int i = 0;
    while (token != nullptr)
    {
      p.coords[i++] = std::strtof(token, nullptr);
      token = strtok(nullptr, ",");
    }
    points.push_back(p);
  }

  ifs.close();
  return points;
}